

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# akarin_timer.cpp
# Opt level: O2

void AkarinTimer::mark_end(char *p_mark)

{
  int iVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  char *in_RDI;
  __node_base *p_Var4;
  float fVar5;
  key_type local_18;
  
  p_Var4 = &chrono_timer_marks._M_h._M_before_begin;
  do {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "you are attempting to close a marker that have not been registered")
      ;
      goto LAB_00306f6c;
    }
    iVar1 = strcmp(in_RDI,(char *)p_Var4[1]._M_nxt);
  } while (iVar1 != 0);
  fVar5 = get_current_time();
  poVar2 = std::operator<<((ostream *)&std::cout,"timer_mark name:");
  poVar2 = std::operator<<(poVar2,in_RDI);
  poVar2 = std::operator<<(poVar2," time:");
  pmVar3 = std::__detail::
           _Map_base<const_char_*,_std::pair<const_char_*const,_float>,_std::allocator<std::pair<const_char_*const,_float>_>,_std::__detail::_Select1st,_std::equal_to<const_char_*>,_std::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<const_char_*,_std::pair<const_char_*const,_float>,_std::allocator<std::pair<const_char_*const,_float>_>,_std::__detail::_Select1st,_std::equal_to<const_char_*>,_std::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&chrono_timer_marks,&local_18);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,fVar5 - *pmVar3);
LAB_00306f6c:
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void AkarinTimer::mark_end(
    const char *p_mark) noexcept
{
    auto find_iter = std::find_if(
        chrono_timer_marks.cbegin(),
        chrono_timer_marks.cend(),
        [p_mark](const std::pair<const char *, float> &p_timer_iter) -> bool {
            return strcmp(p_mark, p_timer_iter.first) == 0;
        });
    if (find_iter == chrono_timer_marks.cend())
    {
        std::cerr << "you are attempting to close a marker that have not been registered"
                  << "\n";
        return;
    }

    const auto &current_time = get_current_time();
    std::cout << "timer_mark name:" << p_mark << " time:" << current_time - chrono_timer_marks[p_mark] << "\n";
}